

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getStateDir.cpp
# Opt level: O3

int main(void)

{
  string local_28;
  
  sago::getStateDir_abi_cxx11_();
  run_test(&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main() {
	run_test(sago::getStateDir());
	return 0;
}